

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_3,_4>,_tcu::Vector<double,_3>,_tcu::Vector<double,_4>_>::call
          (binary<tcu::Matrix<double,_3,_4>,_tcu::Vector<double,_3>,_tcu::Vector<double,_4>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int row_1;
  GLdouble *data;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  uint uVar8;
  Vector<double,_3> arg_1;
  Vector<double,_4> arg_2;
  Matrix<double,_3,_4> result;
  undefined8 local_e8 [13];
  undefined1 local_80 [96];
  
  lVar6 = 0;
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  puVar3 = local_e8;
  local_e8[10] = 0;
  local_e8[0xb] = 0;
  local_e8[8] = 0;
  local_e8[9] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3ff00000;
      if (lVar6 != lVar5) {
        uVar8 = 0;
      }
      *(ulong *)((long)puVar3 + lVar5) = (ulong)uVar8 << 0x20;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x60);
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 1;
    lVar6 = lVar6 + 0x18;
  } while (lVar4 != 3);
  puVar7 = local_80;
  (*pcVar1)(puVar7);
  puVar3 = local_e8;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)puVar3 + lVar6) = *(undefined8 *)(puVar7 + lVar6);
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x60);
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 1;
    puVar7 = puVar7 + 8;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)result_dst + lVar4 + 0x10) =
         *(undefined8 *)((long)local_e8 + lVar4 + 0x10);
    uVar2 = *(undefined8 *)((long)local_e8 + lVar4 + 8);
    *(undefined8 *)((long)result_dst + lVar4) = *(undefined8 *)((long)local_e8 + lVar4);
    ((undefined8 *)((long)result_dst + lVar4))[1] = uVar2;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x60);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}